

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcover.c
# Opt level: O0

void cover_inflate(void)

{
  int in_stack_00000094;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  int in_stack_00000138;
  uint in_stack_0000013c;
  int in_stack_00000140;
  uint in_stack_00000144;
  char *in_stack_00000148;
  char *in_stack_00000150;
  
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  try(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  inf(in_stack_00000150,in_stack_00000148,in_stack_00000144,in_stack_00000140,in_stack_0000013c,
      in_stack_00000138);
  inf(in_stack_00000150,in_stack_00000148,in_stack_00000144,in_stack_00000140,in_stack_0000013c,
      in_stack_00000138);
  return;
}

Assistant:

static void cover_inflate(void) {
    try("0 0 0 0 0", "invalid stored block lengths", 1);
    try("3 0", "fixed", 0);
    try("6", "invalid block type", 1);
    try("1 1 0 fe ff 0", "stored", 0);
    try("fc 0 0", "too many length or distance symbols", 1);
    try("4 0 fe ff", "invalid code lengths set", 1);
    try("4 0 24 49 0", "invalid bit length repeat", 1);
    try("4 0 24 e9 ff ff", "invalid bit length repeat", 1);
    try("4 0 24 e9 ff 6d", "invalid code -- missing end-of-block", 1);
    try("4 80 49 92 24 49 92 24 71 ff ff 93 11 0",
        "invalid literal/lengths set", 1);
    try("4 80 49 92 24 49 92 24 f b4 ff ff c3 84", "invalid distances set", 1);
    try("4 c0 81 8 0 0 0 0 20 7f eb b 0 0", "invalid literal/length code", 1);
    try("2 7e ff ff", "invalid distance code", 1);
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    try("c c0 81 0 0 0 0 0 90 ff 6b 4 0", "invalid distance too far back", 0);
#else
    try("c c0 81 0 0 0 0 0 90 ff 6b 4 0", "invalid distance too far back", 1);
#endif

    /* also trailer mismatch just in inflate() */
    try("1f 8b 8 0 0 0 0 0 0 0 3 0 0 0 0 1", "incorrect data check", -1);
    try("1f 8b 8 0 0 0 0 0 0 0 3 0 0 0 0 0 0 0 0 1",
        "incorrect length check", -1);
    try("5 c0 21 d 0 0 0 80 b0 fe 6d 2f 91 6c", "pull 17", 0);
    try("5 e0 81 91 24 cb b2 2c 49 e2 f 2e 8b 9a 47 56 9f fb fe ec d2 ff 1f",
        "long code", 0);
    try("ed c0 1 1 0 0 0 40 20 ff 57 1b 42 2c 4f", "length extra", 0);
    try("ed cf c1 b1 2c 47 10 c4 30 fa 6f 35 1d 1 82 59 3d fb be 2e 2a fc f c",
        "long distance and extra", 0);
    try("ed c0 81 0 0 0 0 80 a0 fd a9 17 a9 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 "
        "0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 6", "window end", 0);
    inf("2 8 20 80 0 3 0", "inflate_fast TYPE return", 0, -15, 258,
        Z_STREAM_END);
    inf("63 18 5 40 c 0", "window wrap", 3, -8, 300, Z_OK);
}